

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixedEnvelopes.cpp
# Opt level: O2

void __thiscall
IsoSpec::FixedEnvelope::stochastic_init<false>
          (FixedEnvelope *this,Iso *iso,size_t _no_molecules,double _precision,double _beta_bias)

{
  double *pdVar1;
  double *pdVar2;
  IsoLayeredGenerator *this_00;
  bool bVar3;
  double *pdVar4;
  size_t sVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  IsoStochasticGenerator generator;
  IsoStochasticGenerator local_168;
  
  IsoStochasticGenerator::IsoStochasticGenerator(&local_168,iso,_no_molecules,_precision,_beta_bias)
  ;
  this->allDim = local_168.super_IsoGenerator.super_Iso.allDim;
  this->allDimSizeofInt = local_168.super_IsoGenerator.super_Iso.allDim << 2;
  reallocate_memory<false>(this,0x400);
  this_00 = &local_168.ILG;
  do {
    if (local_168.to_sample_left == 0) {
LAB_0011f328:
      IsoStochasticGenerator::~IsoStochasticGenerator(&local_168);
      return;
    }
    if (local_168.confs_prob < local_168.chasing_prob) {
      local_168.current_count = 1;
      local_168.to_sample_left = local_168.to_sample_left - 1;
      while (pdVar1 = local_168.ILG.lProbs_ptr + 1, pdVar2 = local_168.ILG.lProbs_ptr + 1,
            pdVar4 = local_168.ILG.lProbs_ptr, local_168.ILG.lProbs_ptr = pdVar1,
            *pdVar2 < local_168.ILG.lcfmsv) {
        bVar3 = IsoLayeredGenerator::carry(this_00);
        if ((!bVar3) && (bVar3 = IsoLayeredGenerator::nextLayer(this_00,-2.0), !bVar3))
        goto LAB_0011f328;
      }
      while (local_168.confs_prob =
                  local_168.ILG.super_IsoGenerator.partialProbs[1] *
                  ((*local_168.ILG.marginalResults)->probs).store
                  [(int)((ulong)((long)pdVar4 + (8 - (long)local_168.ILG.lProbs_ptr_start)) >> 3)] +
                  local_168.confs_prob, local_168.confs_prob <= local_168.chasing_prob) {
        while (pdVar1 = local_168.ILG.lProbs_ptr + 1, pdVar2 = local_168.ILG.lProbs_ptr + 1,
              pdVar4 = local_168.ILG.lProbs_ptr, local_168.ILG.lProbs_ptr = pdVar1,
              *pdVar2 < local_168.ILG.lcfmsv) {
          bVar3 = IsoLayeredGenerator::carry(this_00);
          if ((!bVar3) && (bVar3 = IsoLayeredGenerator::nextLayer(this_00,-2.0), !bVar3))
          goto LAB_0011f328;
        }
      }
      if (local_168.to_sample_left != 0) {
        dVar6 = local_168.confs_prob - local_168.chasing_prob;
        goto LAB_0011f1dd;
      }
      goto LAB_0011f318;
    }
    local_168.current_count = 0;
    while (local_168.ILG.lProbs_ptr[1] < local_168.ILG.lcfmsv) {
      local_168.ILG.lProbs_ptr = local_168.ILG.lProbs_ptr + 1;
      bVar3 = IsoLayeredGenerator::carry(this_00);
      if ((!bVar3) && (bVar3 = IsoLayeredGenerator::nextLayer(this_00,-2.0), !bVar3))
      goto LAB_0011f328;
    }
    dVar6 = local_168.ILG.super_IsoGenerator.partialProbs[1] *
            ((*local_168.ILG.marginalResults)->probs).store
            [(int)((ulong)((long)local_168.ILG.lProbs_ptr +
                          (8 - (long)local_168.ILG.lProbs_ptr_start)) >> 3)];
    local_168.confs_prob = local_168.confs_prob + dVar6;
    local_168.ILG.lProbs_ptr = local_168.ILG.lProbs_ptr + 1;
LAB_0011f1dd:
    dVar10 = local_168.precision - local_168.chasing_prob;
    auVar9._8_4_ = (int)(local_168.to_sample_left >> 0x20);
    auVar9._0_8_ = local_168.to_sample_left;
    auVar9._12_4_ = 0x45300000;
    dVar7 = (auVar9._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)local_168.to_sample_left) - 4503599627370496.0);
    if ((dVar6 * dVar7) / dVar10 <= local_168.beta_bias) {
      dVar6 = rdvariate_beta_1_b(dVar7,(mt19937 *)random_gen);
      for (dVar6 = dVar6 * dVar10; dVar7 = local_168.precision,
          dVar6 = dVar6 + local_168.chasing_prob, local_168.chasing_prob = dVar6,
          dVar6 <= local_168.confs_prob; dVar6 = dVar10 * (dVar7 - dVar6)) {
        local_168.current_count = local_168.current_count + 1;
        local_168.to_sample_left = local_168.to_sample_left - 1;
        if (local_168.to_sample_left == 0) goto LAB_0011f318;
        auVar8._8_4_ = (int)(local_168.to_sample_left >> 0x20);
        auVar8._0_8_ = local_168.to_sample_left;
        auVar8._12_4_ = 0x45300000;
        dVar10 = rdvariate_beta_1_b((auVar8._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)local_168.to_sample_left) -
                                    4503599627370496.0),(mt19937 *)random_gen);
      }
    }
    else {
      sVar5 = rdvariate_binom(local_168.to_sample_left,dVar6 / dVar10,(mt19937 *)random_gen);
      local_168.to_sample_left = local_168.to_sample_left - sVar5;
      local_168.current_count = local_168.current_count + sVar5;
      local_168.chasing_prob = local_168.confs_prob;
    }
    if (local_168.current_count != 0) {
LAB_0011f318:
      addConfILG<false,IsoSpec::IsoStochasticGenerator>(this,&local_168);
    }
  } while( true );
}

Assistant:

void FixedEnvelope::stochastic_init(Iso&& iso, size_t _no_molecules, double _precision, double _beta_bias)
{
    IsoStochasticGenerator generator(std::move(iso), _no_molecules, _precision, _beta_bias);

    this->allDim = generator.getAllDim();
    this->allDimSizeofInt = this->allDim * sizeof(int);

    this->reallocate_memory<tgetConfs>(ISOSPEC_INIT_TABLE_SIZE);

    while(generator.advanceToNextConfiguration())
        addConfILG<tgetConfs, IsoStochasticGenerator>(generator);
}